

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceBuffer * __thiscall
slang::SourceManager::assignText
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view path,
          string_view text,SourceLocation includedFrom)

{
  ulong *puVar1;
  long *plVar2;
  atomic<unsigned_int> *paVar3;
  uint __val;
  bool bVar4;
  char cVar5;
  char cVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  string_view pathStr;
  string __str;
  string temp;
  vector<char,_std::allocator<char>_> local_f8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  SourceManager *local_98;
  undefined7 *local_90;
  long local_88;
  undefined7 local_80;
  undefined1 uStack_79;
  undefined7 uStack_78;
  undefined1 local_71;
  char *local_70;
  size_t local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined6 uStack_3e;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  sVar10 = path._M_len;
  pcVar12 = path._M_str;
  local_98 = this;
  if (path._M_len != 0) goto LAB_001a8c1e;
  local_80 = 0x656d616e6e753c;
  uStack_79 = 100;
  uStack_78 = 0x7265666675625f;
  local_88 = 0xf;
  local_71 = 0;
  cVar6 = '\x01';
  LOCK();
  paVar3 = &this->unnamedBufferCount;
  __val = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  (paVar3->super___atomic_base<unsigned_int>)._M_i =
       (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (9 < __val) {
    uVar8 = __val;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar8 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_001a89f1;
      }
      if (uVar8 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_001a89f1;
      }
      if (uVar8 < 10000) goto LAB_001a89f1;
      bVar4 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar4);
    cVar6 = cVar6 + '\x01';
  }
LAB_001a89f1:
  local_b8 = local_a8;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,local_b0,__val);
  uVar9 = CONCAT44(uStack_ac,local_b0) + local_88;
  uVar11 = 0xf;
  if (local_90 != &local_80) {
    uVar11 = CONCAT17(uStack_79,local_80);
  }
  if (uVar11 < uVar9) {
    uVar11 = 0xf;
    if (local_b8 != local_a8) {
      uVar11 = local_a8[0];
    }
    if (uVar11 < uVar9) goto LAB_001a8a55;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_001a8a55:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b8);
  }
  local_d8 = &local_c8;
  puVar1 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar1) {
    local_c8 = *puVar1;
    uStack_c0 = puVar7[3];
  }
  else {
    local_c8 = *puVar1;
    local_d8 = (ulong *)*puVar7;
  }
  local_d0 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_40 = 0x3e;
  local_48 = 1;
  uVar9 = 0xf;
  if (local_d8 != &local_c8) {
    uVar9 = local_c8;
  }
  local_50 = &local_40;
  if ((local_d0 + 1U < 0x10) && (uVar9 < local_d0 + 1U)) {
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_d8);
  }
  else {
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)&local_40);
  }
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  plVar2 = puVar7 + 2;
  if ((pointer *)*puVar7 == (pointer *)plVar2) {
    local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar2;
    uStack_e0 = puVar7[3];
  }
  else {
    local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar2;
    local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar7;
  }
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)puVar7[1];
  *puVar7 = plVar2;
  puVar7[1] = 0;
  *(undefined1 *)plVar2 = 0;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f8);
  if ((pointer *)
      local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT62(uStack_3e,local_40) + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  sVar10 = local_68;
  pcVar12 = local_70;
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT17(uStack_79,local_80) + 1);
    sVar10 = local_68;
    pcVar12 = local_70;
  }
LAB_001a8c1e:
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&local_f8,0,text._M_str,text._M_str + text._M_len)
  ;
  if ((local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish) ||
     (local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] != '\0')) {
    local_d8 = (ulong *)((ulong)local_d8 & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_f8,(char *)&local_d8);
  }
  pathStr._M_str = pcVar12;
  pathStr._M_len = sVar10;
  assignBuffer(__return_storage_ptr__,local_98,pathStr,&local_f8,includedFrom);
  if (local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SourceBuffer SourceManager::assignText(string_view path, string_view text,
                                       SourceLocation includedFrom) {
    std::string temp;
    if (path.empty()) {
        using namespace std::literals;
        temp = "<unnamed_buffer"s + std::to_string(unnamedBufferCount++) + ">"s;
        path = temp;
    }

    std::vector<char> buffer;
    buffer.insert(buffer.end(), text.begin(), text.end());
    if (buffer.empty() || buffer.back() != '\0')
        buffer.push_back('\0');

    return assignBuffer(path, std::move(buffer), includedFrom);
}